

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

DynamicStackArray<float,_16UL,_64UL> * __thiscall
embree::DynamicStackArray<float,_16UL,_64UL>::operator=
          (DynamicStackArray<float,_16UL,_64UL> *this,DynamicStackArray<float,_16UL,_64UL> *other)

{
  float fVar1;
  DynamicStackArray<float,_16UL,_64UL> *pDVar2;
  ulong uVar3;
  ulong uVar4;
  
  pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)other->data;
  uVar4 = 0;
  do {
    fVar1 = pDVar2->arr[uVar4];
    if (0xf < uVar4) {
      DynamicStackArray<float,16ul,64ul>::operator=
                ((DynamicStackArray<float,16ul,64ul> *)&this->data);
    }
    this->data[uVar4] = fVar1;
    uVar4 = uVar4 + 1;
    pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)other->data;
    uVar3 = 0x40;
    if (pDVar2 == other) {
      uVar3 = 0x10;
    }
  } while (uVar4 < uVar3);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }